

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

int qpdf_find_page_by_id(qpdf_data qpdf,int objid,int generation)

{
  uint uVar1;
  anon_class_16_2_7fa27321 local_60;
  function<void_(_qpdf_data_*)> local_50;
  QPDF_ERROR_CODE code;
  QPDFObjGen og;
  int n;
  int generation_local;
  int objid_local;
  qpdf_data qpdf_local;
  
  og.gen = generation;
  QTC::TC("qpdf","qpdf-c called qpdf_find_page_by_id",0);
  og.obj = -1;
  QPDFObjGen::QPDFObjGen((QPDFObjGen *)&stack0xffffffffffffffd4,objid,og.gen);
  local_60.n = &og.obj;
  local_60.og = (QPDFObjGen *)&stack0xffffffffffffffd4;
  std::function<void(_qpdf_data*)>::function<qpdf_find_page_by_id::__0,void>
            ((function<void(_qpdf_data*)> *)&local_50,&local_60);
  uVar1 = trap_errors(qpdf,&local_50);
  std::function<void_(_qpdf_data_*)>::~function(&local_50);
  if ((uVar1 & 2) == 0) {
    qpdf_local._4_4_ = og.obj;
  }
  else {
    qpdf_local._4_4_ = -1;
  }
  return qpdf_local._4_4_;
}

Assistant:

int
qpdf_find_page_by_id(qpdf_data qpdf, int objid, int generation)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_find_page_by_id");
    int n = -1;
    QPDFObjGen og(objid, generation);
    QPDF_ERROR_CODE code =
        trap_errors(qpdf, [&n, &og](qpdf_data q) { n = QIntC::to_int(q->qpdf->findPage(og)); });
    if (code & QPDF_ERRORS) {
        return -1;
    }
    return n;
}